

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hackdemo.cpp
# Opt level: O2

int main(void)

{
  proto p_Var1;
  ostream *poVar2;
  int binding;
  hackfunc<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_hackdemo_cpp:16:7),_void>
  fn;
  hackfunc<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_codehz[P]funcptr_hackdemo_cpp:23:7),_void>
  fn2;
  int local_7c;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  function<void_(int)> local_50;
  function<void_(int)> local_30;
  
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:16:7)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:16:7)>
             ::_M_manager;
  std::function<void_(int)>::function(&local_50,(function<void_(int)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  p_Var1 = func_ptr::hackfunc::operator_cast_to_function_pointer((hackfunc *)&local_50);
  fake_clib_func(p_Var1);
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = &local_7c;
  local_60 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:23:7)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/codehz[P]funcptr/hackdemo.cpp:23:7)>
             ::_M_manager;
  std::function<void_(int)>::function(&local_30,(function<void_(int)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  p_Var1 = func_ptr::hackfunc::operator_cast_to_function_pointer((hackfunc *)&local_30);
  fake_clib_func(p_Var1);
  poVar2 = std::operator<<((ostream *)&std::cout,"[main] got ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_7c);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  return 0;
}

Assistant:

int main() {
  hackfunc fn{
      [](int input) { std::cout << "directly: " << input << std::endl; }};
  
  fake_clib_func(fn);

  int binding;

  hackfunc fn2{
      [&](int input) { binding = input; }};
  
  fake_clib_func(fn2);
  std::cout << "[main] got " << binding << std::endl;
}